

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryFileManager::IncreaseSizeOnDisk(TemporaryFileManager *this,idx_t bytes)

{
  atomic<unsigned_long> *paVar1;
  StringUtil *this_00;
  OutOfMemoryException *this_01;
  StringUtil *multiplier;
  string data_size;
  string max;
  string used;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = this->size_on_disk;
  this_00 = (StringUtil *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  multiplier = this_00 + bytes;
  if (multiplier <= (StringUtil *)this->max_swap_space) {
    LOCK();
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + bytes;
    UNLOCK();
    return;
  }
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_00,0x400,(idx_t)multiplier);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&local_70,(StringUtil *)this->max_swap_space,0x400,(idx_t)multiplier);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&local_90,(StringUtil *)bytes,0x400,(idx_t)multiplier);
  this_01 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "failed to offload data block of size %s (%s/%s used).\nThis limit was set by the \'max_temp_directory_size\' setting.\nBy default, this setting utilizes the available disk space on the drive where the \'temp_directory\' is located.\nYou can adjust this setting, by using (for example) PRAGMA max_temp_directory_size=\'10GiB\'"
             ,"");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  OutOfMemoryException::
  OutOfMemoryException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_01,&local_b0,&local_d0,&local_f0,&local_110);
  __cxa_throw(this_01,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemporaryFileManager::IncreaseSizeOnDisk(idx_t bytes) {
	auto current_size_on_disk = GetTotalUsedSpaceInBytes();
	if (current_size_on_disk + bytes > max_swap_space) {
		auto used = StringUtil::BytesToHumanReadableString(current_size_on_disk);
		auto max = StringUtil::BytesToHumanReadableString(max_swap_space);
		auto data_size = StringUtil::BytesToHumanReadableString(bytes);
		throw OutOfMemoryException(R"(failed to offload data block of size %s (%s/%s used).
This limit was set by the 'max_temp_directory_size' setting.
By default, this setting utilizes the available disk space on the drive where the 'temp_directory' is located.
You can adjust this setting, by using (for example) PRAGMA max_temp_directory_size='10GiB')",
		                           data_size, used, max);
	}
	size_on_disk += bytes;
}